

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int default_emit_certificate_cb
              (ptls_emit_certificate_t *_self,ptls_t *tls,ptls_message_emitter_t *emitter,
              ptls_key_schedule_t *key_sched,ptls_iovec_t context,int push_status_request)

{
  ptls_buffer_t *buf;
  size_t sVar1;
  uint8_t *puVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ptls_hash_context_t **pppVar8;
  size_t sVar9;
  size_t sVar10;
  
  iVar5 = (*emitter->begin_message)(emitter);
  if (iVar5 == 0) {
    buf = emitter->buf;
    sVar1 = buf->off;
    iVar5 = ptls_buffer_reserve(buf,1);
    if (iVar5 == 0) {
      buf->base[buf->off] = '\v';
      buf->off = buf->off + 1;
      iVar5 = 0;
    }
    bVar4 = true;
    if (iVar5 == 0) {
      iVar5 = ptls_buffer_reserve(buf,3);
      if (iVar5 == 0) {
        puVar2 = buf->base;
        sVar10 = buf->off;
        puVar2[sVar10 + 2] = '\0';
        puVar2 = puVar2 + sVar10;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        buf->off = buf->off + 3;
        iVar5 = 0;
      }
      bVar4 = true;
      if (iVar5 == 0) {
        sVar10 = buf->off;
        iVar5 = ptls_build_certificate_message
                          (emitter->buf,context,(tls->ctx->certificates).list,
                           (tls->ctx->certificates).count,(ptls_iovec_t)ZEXT816(0));
        if (iVar5 == 0) {
          uVar6 = buf->off - sVar10;
          lVar7 = 0x10;
          do {
            buf->base[sVar10 - 3] = (uint8_t)(uVar6 >> ((byte)lVar7 & 0x3f));
            lVar7 = lVar7 + -8;
            sVar10 = sVar10 + 1;
          } while (lVar7 != -8);
          bVar4 = false;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          bVar4 = true;
        }
      }
      else {
        bVar3 = false;
      }
      if (bVar3) {
        bVar4 = false;
        if ((key_sched != (ptls_key_schedule_t *)0x0) && (key_sched->num_hashes != 0)) {
          puVar2 = buf->base;
          sVar10 = buf->off;
          pppVar8 = &key_sched->hashes[0].ctx;
          sVar9 = 0;
          do {
            (*(*pppVar8)->update)(*pppVar8,puVar2 + sVar1,sVar10 - sVar1);
            sVar9 = sVar9 + 1;
            pppVar8 = pppVar8 + 2;
          } while (sVar9 != key_sched->num_hashes);
          bVar4 = false;
        }
      }
    }
    if (!bVar4) {
      iVar5 = (*emitter->commit_message)(emitter);
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

static int default_emit_certificate_cb(ptls_emit_certificate_t *_self, ptls_t *tls, ptls_message_emitter_t *emitter,
                                       ptls_key_schedule_t *key_sched, ptls_iovec_t context, int push_status_request)
{
    int ret;

    ptls_push_message(emitter, key_sched, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
        if ((ret = ptls_build_certificate_message(emitter->buf, context, tls->ctx->certificates.list, tls->ctx->certificates.count,
                                                  ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    });

    ret = 0;
Exit:
    return ret;
}